

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O2

int bip32_key_from_parent(ext_key *hdkey,uint32_t child_num,uint32_t flags,ext_key *key_out)

{
  uchar *seckey;
  uint32_t uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  _Bool _Var5;
  int iVar6;
  secp256k1_context_struct *ctx;
  ulong uVar7;
  uint32_t uVar8;
  bool bVar9;
  size_t len;
  uchar *local_b8;
  sha512 sha;
  secp256k1_pubkey pub_key;
  
  if (hdkey == (ext_key *)0x0) {
    return -2;
  }
  bVar9 = hdkey->priv_key[0] != '\0';
  if (7 < flags) {
    return -2;
  }
  if (key_out == (ext_key *)0x0) {
    return -2;
  }
  ctx = secp_ctx();
  if (ctx == (secp256k1_context_struct *)0x0) {
    return -3;
  }
  if (((flags & 1) != 0 && -1 < (int)child_num || !bVar9) && (hdkey->depth != 0xff)) {
    local_b8 = key_out->priv_key;
    uVar7 = (ulong)(~child_num >> 0x19) | 0x3f;
    key_out->priv_key[0x20] = hdkey->parent160[uVar7];
    uVar2 = *(undefined8 *)(hdkey->chain_code + uVar7);
    uVar3 = *(undefined8 *)(hdkey->chain_code + uVar7 + 8);
    uVar4 = *(undefined8 *)(hdkey->chain_code + uVar7 + 0x10 + 8);
    *(undefined8 *)(key_out->priv_key + 0x10) = *(undefined8 *)(hdkey->chain_code + uVar7 + 0x10);
    *(undefined8 *)(key_out->priv_key + 0x18) = uVar4;
    *(undefined8 *)key_out->priv_key = uVar2;
    *(undefined8 *)(key_out->priv_key + 8) = uVar3;
    key_out->child_num =
         child_num >> 0x18 | (child_num & 0xff0000) >> 8 | (child_num & 0xff00) << 8 |
         child_num << 0x18;
    hmac_sha512_impl(&sha,hdkey->chain_code,0x20,local_b8,0x25);
    *(uint64_t *)(key_out->chain_code + 0x10) = sha.u.u64[6];
    *(uint64_t *)(key_out->chain_code + 0x18) = sha.u.u64[7];
    *(uint64_t *)key_out->chain_code = sha.u.u64[4];
    *(uint64_t *)(key_out->chain_code + 8) = sha.u.u64[5];
    if (bVar9) {
      len = 0x21;
      iVar6 = pubkey_parse(&pub_key,hdkey->pub_key,0x21);
      if ((((iVar6 != 0) &&
           (iVar6 = secp256k1_ec_pubkey_tweak_add(ctx,&pub_key,(uchar *)&sha), iVar6 != 0)) &&
          (iVar6 = pubkey_serialize(key_out->pub_key,&len,&pub_key,0x102), iVar6 != 0)) &&
         (len == 0x21)) {
        if (flags < 4) {
LAB_0012d099:
          uVar1 = hdkey->version;
          if ((flags & 1) == 0) {
            if ((uVar1 == 0x488b21e) || (uVar1 == 0x488ade4)) {
              key_out->version = 0x488ade4;
            }
            else {
              key_out->version = 0x4358394;
            }
          }
          else {
            uVar8 = 0x43587cf;
            if (uVar1 == 0x488ade4) {
              uVar8 = 0x488b21e;
            }
            if (uVar1 == 0x488b21e) {
              uVar8 = 0x488b21e;
            }
            key_out->version = uVar8;
            bip32_key_strip_private_key(key_out);
          }
          key_out->depth = hdkey->depth + '\x01';
          key_out->child_num = child_num;
          if ((flags & 2) == 0) {
            *(undefined4 *)(key_out->parent160 + 0x10) = *(undefined4 *)(hdkey->hash160 + 0x10);
            uVar2 = *(undefined8 *)(hdkey->hash160 + 8);
            *(undefined8 *)key_out->parent160 = *(undefined8 *)hdkey->hash160;
            *(undefined8 *)(key_out->parent160 + 8) = uVar2;
            key_compute_hash160(key_out);
          }
          else {
            wally_clear_2(key_out->parent160,0x14,key_out->hash160,0x14);
          }
          wally_clear(&sha,0x40);
          return 0;
        }
        seckey = key_out->pub_key_tweak_sum;
        _Var5 = mem_is_zero(seckey,0x20);
        if (_Var5) {
          *(uint64_t *)(key_out->pub_key_tweak_sum + 0x10) = sha.u.u64[2];
          *(uint64_t *)(key_out->pub_key_tweak_sum + 0x18) = sha.u.u64[3];
          *(uint64_t *)seckey = sha.u.u64[0];
          *(uint64_t *)(key_out->pub_key_tweak_sum + 8) = sha.u.u64[1];
          goto LAB_0012d099;
        }
        iVar6 = privkey_tweak_add(seckey,(uchar *)&sha);
        if (iVar6 != 0) goto LAB_0012d099;
      }
    }
    else {
      local_b8[0x20] = hdkey->priv_key[0x20];
      uVar2 = *(undefined8 *)hdkey->priv_key;
      uVar3 = *(undefined8 *)(hdkey->priv_key + 8);
      uVar4 = *(undefined8 *)(hdkey->priv_key + 0x18);
      *(undefined8 *)(local_b8 + 0x10) = *(undefined8 *)(hdkey->priv_key + 0x10);
      *(undefined8 *)(local_b8 + 0x18) = uVar4;
      *(undefined8 *)local_b8 = uVar2;
      *(undefined8 *)(local_b8 + 8) = uVar3;
      iVar6 = privkey_tweak_add(key_out->priv_key + 1,(uchar *)&sha);
      if ((iVar6 != 0) && (iVar6 = key_compute_pub_key(key_out), iVar6 == 0)) goto LAB_0012d099;
    }
    wally_clear(&sha,0x40);
  }
  wipe_key_fail(key_out);
  return -2;
}

Assistant:

int bip32_key_from_parent(const struct ext_key *hdkey, uint32_t child_num,
                          uint32_t flags, struct ext_key *key_out)
{
    struct sha512 sha;
    const secp256k1_context *ctx;
    const bool we_are_private = hdkey && key_is_private(hdkey);
    const bool derive_private = !(flags & BIP32_FLAG_KEY_PUBLIC);
    const bool hardened = child_is_hardened(child_num);

    if (flags & ~BIP32_ALL_DEFINED_FLAGS)
        return WALLY_EINVAL; /* These flags are not defined yet */

    if (!hdkey || !key_out)
        return WALLY_EINVAL;

    if (!(ctx = secp_ctx()))
        return WALLY_ENOMEM;

    if (!we_are_private && (derive_private || hardened))
        return wipe_key_fail(key_out); /* Unsupported derivation */

    if (hdkey->depth == 0xff)
        return wipe_key_fail(key_out); /* Maximum depth reached */

    /*
     *  Private parent -> private child:
     *    CKDpriv((kpar, cpar), i) -> (ki, ci)
     *
     *  Private parent -> public child:
     *    N(CKDpriv((kpar, cpar), i) -> (ki, ci))
     *  As we always calculate the public key, we can derive a public
     *  child by deriving a private one and stripping its private key.
     *
     * Public parent -> non hardened public child
     *    CKDpub((Kpar, cpar), i) -> (Ki, ci)
     */

    /* NB: We use the key_outs' priv_key+child_num to hold 'Data' here */
    if (hardened) {
        /* Hardened: Data = 0x00 || ser256(kpar) || ser32(i)) */
        memcpy(key_out->priv_key, hdkey->priv_key, sizeof(hdkey->priv_key));
    } else {
        /* Non Hardened Private: Data = serP(point(kpar)) || ser32(i)
         * Non Hardened Public : Data = serP(kpar) || ser32(i)
         *   point(kpar) when par is private is the public key.
         */
        memcpy(key_out->priv_key, hdkey->pub_key, sizeof(hdkey->pub_key));
    }

    /* This is the '|| ser32(i)' part of the above */
    key_out->child_num = cpu_to_be32(child_num);

    /* I = HMAC-SHA512(Key = cpar, Data) */
    hmac_sha512_impl(&sha, hdkey->chain_code, sizeof(hdkey->chain_code),
                     key_out->priv_key,
                     sizeof(key_out->priv_key) + sizeof(key_out->child_num));

    /* Split I into two 32-byte sequences, IL and IR
     * The returned chain code ci is IR (i.e. the 2nd half of our hmac sha512)
     */
    memcpy(key_out->chain_code, sha.u.u8 + sizeof(sha) / 2,
           sizeof(key_out->chain_code));

    if (we_are_private) {
        /* The returned child key ki is parse256(IL) + kpar (mod n)
         * In case parse256(IL) ≥ n or ki = 0, the resulting key is invalid
         * (NOTE: privkey_tweak_add checks both conditions)
         */
        memcpy(key_out->priv_key, hdkey->priv_key, sizeof(hdkey->priv_key));
        if (!privkey_tweak_add(key_out->priv_key + 1, sha.u.u8)) {
            wally_clear(&sha, sizeof(sha));
            return wipe_key_fail(key_out); /* Out of bounds FIXME: Iterate to the next? */
        }

        if (key_compute_pub_key(key_out) != WALLY_OK) {
            wally_clear(&sha, sizeof(sha));
            return wipe_key_fail(key_out);
        }
    } else {
        /* The returned child key ki is point(parse256(IL) + kpar)
         * In case parse256(IL) ≥ n or Ki is the point at infinity, the
         * resulting key is invalid (NOTE: pubkey_tweak_add checks both
         * conditions)
         */
        secp256k1_pubkey pub_key;
        size_t len = sizeof(key_out->pub_key);

        /* FIXME: Out of bounds on pubkey_tweak_add */
        if (!pubkey_parse(&pub_key, hdkey->pub_key, sizeof(hdkey->pub_key)) ||
            !pubkey_tweak_add(ctx, &pub_key, sha.u.u8) ||
            !pubkey_serialize(key_out->pub_key, &len, &pub_key,
                              PUBKEY_COMPRESSED) ||
            len != sizeof(key_out->pub_key)
#ifdef BUILD_ELEMENTS
            || ((flags & BIP32_FLAG_KEY_TWEAK_SUM) &&
                bip32_privkey_tweak_add(sha.u.u8, SHA256_LEN, key_out) != WALLY_OK)
#endif /* BUILD_ELEMENTS */
            ) {
            wally_clear(&sha, sizeof(sha));
            return wipe_key_fail(key_out);
        }
    }

    if (derive_private) {
        if (version_is_mainnet(hdkey->version))
            key_out->version = BIP32_VER_MAIN_PRIVATE;
        else
            key_out->version = BIP32_VER_TEST_PRIVATE;

    } else {
        if (version_is_mainnet(hdkey->version))
            key_out->version = BIP32_VER_MAIN_PUBLIC;
        else
            key_out->version = BIP32_VER_TEST_PUBLIC;

        bip32_key_strip_private_key(key_out);
    }

    key_out->depth = hdkey->depth + 1;
    key_out->child_num = child_num;
    if (flags & BIP32_FLAG_SKIP_HASH)
        wally_clear_2(&key_out->parent160, sizeof(key_out->parent160),
                      &key_out->hash160, sizeof(key_out->hash160));
    else {
        memcpy(key_out->parent160, hdkey->hash160, sizeof(hdkey->hash160));
        key_compute_hash160(key_out);
    }
    wally_clear(&sha, sizeof(sha));
    return WALLY_OK;
}